

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::flatten
          (HlslParseContext *this,TVariable *variable,bool linkage,bool arrayed)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TTypeList *pTVar4;
  undefined4 extraout_var_03;
  TQualifier *outerQualifier;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_bool>
  pVar5;
  TArraySizes *builtInArraySizes;
  TType dereferencedType;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a0;
  TFlattenData local_78;
  TType *this_00;
  undefined4 extraout_var_04;
  
  iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  this_00 = (TType *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*this_00->_vptr_TType[0x29])(this_00);
  if (((char)iVar2 != '\0') && (iVar2 = (*this_00->_vptr_TType[0x25])(this_00), (char)iVar2 == '\0')
     ) {
    return;
  }
  iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xf])(variable);
  iVar3 = (*this_00->_vptr_TType[0xb])(this_00);
  uVar1 = *(ushort *)(CONCAT44(extraout_var_01,iVar3) + 0x20);
  iVar3 = (*this_00->_vptr_TType[0xb])(this_00);
  TFlattenData::TFlattenData
            (&local_78,(uint)uVar1,*(uint *)(CONCAT44(extraout_var_02,iVar3) + 0x1c) & 0xfff);
  dereferencedType._vptr_TType = (_func_int **)CONCAT44(extraout_var_00,iVar2);
  TFlattenData::TFlattenData((TFlattenData *)&dereferencedType.field_0x8,&local_78);
  pVar5 = std::
          _Rb_tree<long_long,std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>,std::_Select1st<std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>>,std::less<long_long>,glslang::pool_allocator<std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>>>
          ::_M_emplace_unique<std::pair<long_long,glslang::HlslParseContext::TFlattenData>>
                    ((_Rb_tree<long_long,std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>,std::_Select1st<std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>>,std::less<long_long>,glslang::pool_allocator<std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>>>
                      *)&this->flattenMap,
                     (pair<long_long,_glslang::HlslParseContext::TFlattenData> *)&dereferencedType);
  iVar2 = (*this_00->_vptr_TType[0x25])(this_00);
  if (((char)iVar2 != '\0') &&
     (pTVar4 = TType::getStruct(this_00),
     (pTVar4->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
     super__Vector_impl_data._M_finish ==
     (pTVar4->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
     super__Vector_impl_data._M_start)) {
    return;
  }
  if (arrayed) {
    TType::TType(&dereferencedType,this_00,0,false);
    iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[3])(variable);
    this_01 = &local_a0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(this_01,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)CONCAT44(extraout_var_03,iVar2));
    iVar2 = (*this_00->_vptr_TType[0xb])(this_00);
    outerQualifier = (TQualifier *)CONCAT44(extraout_var_04,iVar2);
    iVar2 = (*this_00->_vptr_TType[0x13])(this_00);
    builtInArraySizes = (TArraySizes *)CONCAT44(extraout_var_05,iVar2);
    this_00 = &dereferencedType;
  }
  else {
    iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[3])(variable);
    this_01 = &local_c8;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(this_01,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)CONCAT44(extraout_var_06,iVar2));
    iVar2 = (*this_00->_vptr_TType[0xb])(this_00);
    outerQualifier = (TQualifier *)CONCAT44(extraout_var_07,iVar2);
    builtInArraySizes = (TArraySizes *)0x0;
  }
  flatten(this,variable,this_00,(TFlattenData *)&pVar5.first._M_node._M_node[1]._M_parent,this_01,
          linkage,outerQualifier,builtInArraySizes);
  return;
}

Assistant:

void HlslParseContext::flatten(const TVariable& variable, bool linkage, bool arrayed)
{
    const TType& type = variable.getType();

    // If it's a standalone built-in, there is nothing to flatten
    if (type.isBuiltIn() && !type.isStruct())
        return;


    auto entry = flattenMap.insert(std::make_pair(variable.getUniqueId(),
                                                  TFlattenData(type.getQualifier().layoutBinding,
                                                               type.getQualifier().layoutLocation)));

    if (type.isStruct() && type.getStruct()->size()==0)
        return;
    // if flattening arrayed io struct, array each member of dereferenced type
    if (arrayed) {
        const TType dereferencedType(type, 0);
        flatten(variable, dereferencedType, entry.first->second, variable.getName(), linkage,
                type.getQualifier(), type.getArraySizes());
    } else {
        flatten(variable, type, entry.first->second, variable.getName(), linkage,
                type.getQualifier(), nullptr);
    }
}